

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

span<int,_2UL> __thiscall
nonstd::span_lite::span<int,18446744073709551615ul>::subspan<1ul,2ul>
          (span<int,18446744073709551615ul> *this)

{
  bool bVar1;
  size_type sVar2;
  pointer piVar3;
  size_type extraout_RDX;
  span<int,_18446744073709551615UL> *in_RSI;
  span<int,_2UL> sVar4;
  span<int,_2UL> local_28;
  span<int,_18446744073709551615UL> *this_local;
  
  this_local = (span<int,_18446744073709551615UL> *)this;
  bVar1 = detail::is_positive<unsigned_long>(1);
  if ((((!bVar1) || (sVar2 = span<int,_18446744073709551615UL>::size(in_RSI), sVar2 == 0)) ||
      (bVar1 = detail::is_positive<unsigned_long>(2), !bVar1)) ||
     (sVar2 = span<int,_18446744073709551615UL>::size(in_RSI), sVar2 < 3)) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1181: Precondition violation."
              );
  }
  piVar3 = span<int,_18446744073709551615UL>::data(in_RSI);
  span<int,_2UL>::span(&local_28,piVar3 + 1,2);
  span<int,_2UL>::span((span<int,_2UL> *)this,&local_28);
  span<int,_2UL>::~span(&local_28);
  sVar4.size_ = extraout_RDX;
  sVar4.data_ = (pointer)this;
  return sVar4;
}

Assistant:

span_constexpr_exp span< element_type, Count >
    subspan() const
    {
        span_EXPECTS(
            ( detail::is_positive( Offset ) && Offset <= size() ) &&
            ( Count == dynamic_extent || (detail::is_positive( Count ) && Count + Offset <= size()) )
        );

        return span< element_type, Count >(
            data() + Offset, Count != dynamic_extent ? Count : (Extent != dynamic_extent ? Extent - Offset : size() - Offset) );
    }